

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::ld_a_dhld(SM83 *this)

{
  u16 addr;
  u8 uVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  SM83 *this_local;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x49;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  LD A, (HL-)\n",fmt
             ,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)this);
  addr = (this->field_3).hl;
  (this->field_3).hl = addr - 1;
  uVar1 = Bus::Read8(this->bus,addr,true);
  (this->field_0).field_1.a = uVar1;
  return;
}

Assistant:

void SM83::ld_a_dhld() {
    LTRACE("LD A, (HL-)");
    a = bus.Read8(hl--);
}